

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall cmCTest::SetTest(cmCTest *this,string *ttype,bool report)

{
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var1;
  bool bVar2;
  Part PVar3;
  ostream *poVar4;
  long lVar5;
  char *local_1c0 [4];
  ostringstream cmCTestLog_msg;
  
  cmsys::SystemTools::LowerCase((string *)&cmCTestLog_msg,ttype);
  bVar2 = std::operator==((string *)&cmCTestLog_msg,"all");
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (bVar2) {
    _Var1._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    for (lVar5 = 0; lVar5 != 0x300; lVar5 = lVar5 + 0x40) {
      *(bool *)((long)(_Var1._M_head_impl)->Parts + lVar5 + 0x18U) = true;
    }
  }
  else {
    PVar3 = GetPartFromName(this,ttype);
    if (PVar3 == PartCount) {
      if (report) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Don\'t know about test \"");
        poVar4 = std::operator<<(poVar4,(string *)ttype);
        poVar4 = std::operator<<(poVar4,"\" yet...");
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::stringbuf::str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0x336,local_1c0[0],false);
        std::__cxx11::string::~string((string *)local_1c0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      return false;
    }
    *(bool *)((long)((this->Impl)._M_t.
                     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                     .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Parts +
             (ulong)PVar3 * 0x40 + 0x18) = true;
  }
  return true;
}

Assistant:

bool cmCTest::SetTest(const std::string& ttype, bool report)
{
  if (cmSystemTools::LowerCase(ttype) == "all") {
    for (Part p = PartStart; p != PartCount; p = static_cast<Part>(p + 1)) {
      this->Impl->Parts[p].Enable();
    }
    return true;
  }
  Part p = this->GetPartFromName(ttype);
  if (p != PartCount) {
    this->Impl->Parts[p].Enable();
    return true;
  }
  if (report) {
    cmCTestLog(this, ERROR_MESSAGE,
               "Don't know about test \"" << ttype << "\" yet..."
                                          << std::endl);
  }
  return false;
}